

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11FrameProcessor.cpp
# Opt level: O0

DUPL_RETURN __thiscall
SL::Screen_Capture::X11FrameProcessor::ProcessFrame
          (X11FrameProcessor *this,Monitor *curentmonitorinfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long in_RDI;
  DUPL_RETURN Ret;
  int in_stack_000000f4;
  uchar *in_stack_000000f8;
  Monitor *in_stack_00000100;
  BaseFrameProcessor *in_stack_00000108;
  CaptureData<std::function<void_(const_SL::Screen_Capture::Image_&,_const_SL::Screen_Capture::Monitor_&)>,_std::function<void_(const_SL::Screen_Capture::Image_*,_const_SL::Screen_Capture::MousePoint_&)>,_std::function<std::vector<SL::Screen_Capture::Monitor,_std::allocator<SL::Screen_Capture::Monitor>_>_()>_>
  *in_stack_00000110;
  undefined4 local_4;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x20);
  uVar2 = *(undefined8 *)
           (*(long *)(*(long *)(in_RDI + 0x20) + 0xe8) +
            (long)*(int *)(*(long *)(in_RDI + 0x20) + 0xe0) * 0x80 + 0x10);
  uVar3 = *(undefined8 *)(in_RDI + 0x30);
  iVar4 = OffsetX((Monitor *)(in_RDI + 0x40));
  iVar5 = OffsetY((Monitor *)(in_RDI + 0x40));
  iVar4 = XShmGetImage(uVar1,uVar2,uVar3,iVar4,iVar5,0xffffffffffffffff);
  if (iVar4 != 0) {
    std::
    __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x14ac7e);
    ProcessCapture<SL::Screen_Capture::CaptureData<std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Monitor_const&)>,std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>,std::function<std::vector<SL::Screen_Capture::Monitor,std::allocator<SL::Screen_Capture::Monitor>>()>>,SL::Screen_Capture::Monitor>
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f4);
  }
  local_4 = (DUPL_RETURN)(iVar4 == 0);
  return local_4;
}

Assistant:

DUPL_RETURN X11FrameProcessor::ProcessFrame(const Monitor& curentmonitorinfo)
    {        
        auto Ret = DUPL_RETURN_SUCCESS;
        if(!XShmGetImage(SelectedDisplay,
                         RootWindow(SelectedDisplay, DefaultScreen(SelectedDisplay)),
                         XImage_,
                         OffsetX(SelectedMonitor),
                         OffsetY(SelectedMonitor),
                         AllPlanes)) {
            return DUPL_RETURN_ERROR_EXPECTED;
        }
        ProcessCapture(Data->ScreenCaptureData, *this, SelectedMonitor, (unsigned char*)XImage_->data, XImage_->bytes_per_line);
        return Ret;
    }